

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methodarea.cpp
# Opt level: O0

ClassRuntime * __thiscall MethodArea::loadClassNamed(MethodArea *this,string *className)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ClassRuntime *pCVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  string *psVar9;
  char *__filename;
  ostream *poVar10;
  ExecutionEngine *pEVar11;
  ExecutionEngine *this_00;
  Frame *this_01;
  vector<Value,_std::allocator<Value>_> local_1d8;
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [32];
  Frame *local_170;
  Frame *newFrame;
  VMStack *stackFrame;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  undefined1 local_109;
  ExecutionEngine *pEStack_108;
  bool existsClinit;
  ExecutionEngine *executionEngine;
  ClassRuntime *classRuntime;
  ClassFile *classFile;
  ClassLoader *classLoader;
  FILE *fp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [39];
  allocator local_99;
  string local_98 [8];
  string classFormat;
  allocator local_61;
  string local_60 [8];
  string classLocation;
  string local_40 [8];
  string classNameStr;
  string *className_local;
  MethodArea *this_local;
  
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>_>_>
          ::count(&this->_classes,className);
  if (sVar3 != 0) {
    pCVar4 = getClassNamed(this,className);
    return pCVar4;
  }
  std::__cxx11::string::string(local_40,(string *)className);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,".class",&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  uVar5 = std::__cxx11::string::size();
  uVar6 = std::__cxx11::string::size();
  if (uVar6 <= uVar5) {
    lVar7 = std::__cxx11::string::size();
    lVar8 = std::__cxx11::string::size();
    psVar9 = (string *)std::__cxx11::string::size();
    iVar2 = std::__cxx11::string::compare((ulong)local_40,lVar7 - lVar8,psVar9);
    if (iVar2 == 0) goto LAB_001265fa;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::operator+(local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fp);
  std::__cxx11::string::operator=(local_40,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)&fp);
LAB_001265fa:
  __filename = (char *)std::__cxx11::string::c_str();
  classLoader = (ClassLoader *)fopen(__filename,"rb");
  if ((FILE *)classLoader != (FILE *)0x0) {
    classFile = (ClassFile *)ClassLoader::getInstance();
    classRuntime = (ClassRuntime *)
                   ClassLoader::readClassFile((ClassLoader *)classFile,(FILE *)classLoader);
    pEVar11 = (ExecutionEngine *)operator_new(0x38);
    ClassRuntime::ClassRuntime((ClassRuntime *)pEVar11,(ClassFile *)classRuntime);
    executionEngine = pEVar11;
    addClass(this,(ClassRuntime *)pEVar11);
    fclose((FILE *)classLoader);
    this_00 = ExecutionEngine::getInstance();
    pEVar11 = executionEngine;
    pEStack_108 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"<clinit>",&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"()V",(allocator *)((long)&stackFrame + 7));
    bVar1 = ExecutionEngine::doesMethodExist
                      (this_00,(ClassRuntime *)pEVar11,(string *)local_130,(string *)local_158);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)((long)&stackFrame + 7));
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    local_109 = bVar1;
    if (bVar1) {
      newFrame = (Frame *)VMStack::getInstance();
      this_01 = (Frame *)operator_new(0xb8);
      pEVar11 = executionEngine;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,"<clinit>",&local_191);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,"()V",&local_1b9);
      local_1d8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1d8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1d8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<Value,_std::allocator<Value>_>::vector(&local_1d8);
      Frame::Frame(this_01,(ClassRuntime *)pEVar11,(string *)local_190,(string *)local_1b8,
                   &local_1d8);
      std::vector<Value,_std::allocator<Value>_>::~vector(&local_1d8);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      local_170 = this_01;
      VMStack::addFrame((VMStack *)newFrame,this_01);
    }
    pEVar11 = executionEngine;
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_40);
    return (ClassRuntime *)pEVar11;
  }
  poVar10 = std::operator<<((ostream *)&std::cerr,"NoClassDefFoundError: ");
  poVar10 = std::operator<<(poVar10,local_40);
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

ClassRuntime* MethodArea::loadClassNamed(const string &className) {
    // se a classe já tiver sido carregada, retorna-la
    if (_classes.count(className) > 0) {
        return getClassNamed(className);
    }
    
    string classNameStr(className);
    string classLocation("");
    string classFormat(".class");
    
    if (classNameStr.size() < classFormat.size() || classNameStr.compare(classNameStr.size() - classFormat.size(), classFormat.size(), classFormat) != 0) {
        classNameStr = classLocation + classNameStr + classFormat; // concatena com ".class"
    }

    FILE *fp = fopen(classNameStr.c_str(), "rb");
    if (fp == NULL) {
        cerr << "NoClassDefFoundError: " << classNameStr << endl;
        exit(1);
    }
    
    ClassLoader &classLoader = ClassLoader::getInstance();
    ClassFile *classFile = classLoader.readClassFile(fp);
    ClassRuntime *classRuntime = new ClassRuntime(classFile);
    addClass(classRuntime);
    fclose(fp);
    
    // adicionando <clinit> da classe (se existir) na stack frame.
    ExecutionEngine &executionEngine = ExecutionEngine::getInstance();
    bool existsClinit = executionEngine.doesMethodExist(classRuntime, "<clinit>", "()V");
    if (existsClinit) {
        VMStack &stackFrame = VMStack::getInstance();
        Frame *newFrame = new Frame(classRuntime, "<clinit>", "()V");
        stackFrame.addFrame(newFrame);
    }
    
    return classRuntime;
}